

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Emu.cpp
# Opt level: O2

blargg_err_t __thiscall Spc_File::load_(Spc_File *this,Data_Reader *in)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar3;
  blargg_err_t pcVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar2;
  
  iVar1 = (*in->_vptr_Data_Reader[4])(in);
  uVar2 = CONCAT44(extraout_var,iVar1);
  if ((long)uVar2 < 0x10180) {
    pcVar3 = "Wrong file type for this emulator";
  }
  else {
    iVar1 = (*in->_vptr_Data_Reader[3])(in,&this->header,0x100);
    pcVar3 = (char *)CONCAT44(extraout_var_00,iVar1);
    if ((pcVar3 == (blargg_err_t)0x0) &&
       (pcVar3 = check_spc_header(&this->header), pcVar3 == (blargg_err_t)0x0)) {
      if (0x10200 < uVar2) {
        pcVar4 = blargg_vector<unsigned_char>::resize(&this->xid6,uVar2 - 0x10200);
        if (pcVar4 != (blargg_err_t)0x0) {
          return pcVar4;
        }
        iVar1 = (*in->_vptr_Data_Reader[5])(in,0x10100);
        if ((blargg_err_t)CONCAT44(extraout_var_01,iVar1) != (blargg_err_t)0x0) {
          return (blargg_err_t)CONCAT44(extraout_var_01,iVar1);
        }
        iVar1 = (*in->_vptr_Data_Reader[3])(in,(this->xid6).begin_,(this->xid6).size_);
        if ((blargg_err_t)CONCAT44(extraout_var_02,iVar1) != (blargg_err_t)0x0) {
          return (blargg_err_t)CONCAT44(extraout_var_02,iVar1);
        }
      }
      pcVar3 = (blargg_err_t)0x0;
    }
  }
  return pcVar3;
}

Assistant:

blargg_err_t load_( Data_Reader& in )
	{
		long file_size = in.remain();
		if ( file_size < Snes_Spc::spc_min_file_size )
			return gme_wrong_file_type;
		RETURN_ERR( in.read( &header, Spc_Emu::header_size ) );
		RETURN_ERR( check_spc_header( header.tag ) );
		long const xid6_offset = 0x10200;
		long xid6_size = file_size - xid6_offset;
		if ( xid6_size > 0 )
		{
			RETURN_ERR( xid6.resize( xid6_size ) );
			RETURN_ERR( in.skip( xid6_offset - Spc_Emu::header_size ) );
			RETURN_ERR( in.read( xid6.begin(), (long)xid6.size() ) );
		}
		return 0;
	}